

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall
icu_63::UnicodeSet::applyFilter
          (UnicodeSet *this,Filter filter,void *context,UnicodeSet *inclusions,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UChar32 UVar3;
  UChar32 UVar4;
  int index;
  int start;
  UChar32 ch;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    clear(this);
    iVar2 = getRangeCount(inclusions);
    index = 0;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    start = -1;
    for (; index != iVar2; index = index + 1) {
      UVar3 = getRangeStart(inclusions,index);
      UVar4 = getRangeEnd(inclusions,index);
      for (; UVar3 <= UVar4; UVar3 = UVar3 + 1) {
        UVar1 = (*filter)(UVar3,context);
        if (UVar1 == '\0') {
          if (-1 < start) {
            add(this,start,UVar3 + -1);
            start = -1;
          }
        }
        else if (start < 0) {
          start = UVar3;
        }
      }
    }
    if (-1 < start) {
      add(this,start,0x10ffff);
    }
    if (((this->fFlags & 1) != 0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }